

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O2

void Handle(Trace *trace,int64_t sno,Args *args)

{
  HandlerFn p_Var1;
  Process *pPVar2;
  runtime_error *this;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [6];
  
  if (-1 < sno) {
    if ((0x13f < (ulong)sno) || (p_Var1 = kHandlers[sno], p_Var1 == (HandlerFn)0x0)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_150,sno);
      std::operator+(&local_130,"Unknown syscall ",&local_150);
      std::operator+(&local_110,&local_130," in ");
      pPVar2 = Trace::GetTrace(trace,(pid_t)args->PID);
      Trace::GetFileName_abi_cxx11_(&local_170,trace,pPVar2->image_);
      std::operator+(local_f0,&local_110,&local_170);
      std::runtime_error::runtime_error(this,(string *)local_f0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pPVar2 = Trace::GetTrace(trace,(pid_t)args->PID);
    (*p_Var1)(pPVar2,args);
  }
  return;
}

Assistant:

void Handle(Trace *trace, int64_t sno, const Args &args)
{
  if (sno < 0) {
    return;
  }

  if (sno > sizeof(kHandlers) / sizeof(kHandlers[0]) || !kHandlers[sno]) {
    throw std::runtime_error(
        "Unknown syscall " + std::to_string(sno) + " in " +
        trace->GetFileName(trace->GetTrace(args.PID)->GetImage())
    );
  }

  auto *proc = trace->GetTrace(args.PID);

  try {
    kHandlers[sno](proc, args);
  } catch (std::exception &ex) {
    throw std::runtime_error(
        "Exception while handling syscall " + std::to_string(sno) +
        " in process " + std::to_string(proc->GetUID()) + " (" +
        trace->GetFileName(proc->GetImage()) +
        "): " +
        ex.what()
    );
  }
}